

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O3

ch_primitive ch_vm_call(ch_context *context,ch_string *function_name)

{
  ch_stack *stack;
  uint8_t uVar1;
  byte bVar2;
  ch_dataptr function_ptr;
  ch_primitive_type cVar3;
  ch_jmpptr offset;
  uint8_t *puVar4;
  byte *pbVar5;
  size_t sVar6;
  undefined4 uVar7;
  _Bool _Var8;
  bool bVar9;
  uint uVar10;
  ch_string *pcVar11;
  anon_union_8_4_dd993ae3_for_ch_primitive_1 aVar12;
  ch_primitive *pcVar13;
  ch_upvalue *pcVar14;
  ch_argcount argcount;
  ch_primitive *pcVar15;
  char *pcVar16;
  char *error;
  ch_stack_addr index;
  ch_exit exit;
  undefined8 uVar17;
  ch_upvalue *pcVar18;
  ulong uVar19;
  ch_upvalue *pcVar20;
  ch_bytecode_string cVar21;
  ch_primitive cVar22;
  ch_primitive entry;
  ch_primitive value_00;
  ch_primitive value_01;
  ch_primitive entry_00;
  ch_primitive primitive;
  ch_primitive entry_01;
  ch_primitive value_02;
  ch_primitive entry_02;
  ch_primitive value_03;
  ch_primitive args [2];
  double value;
  ch_primitive local_88;
  ch_primitive local_78;
  ch_string *local_68;
  ch_call_stack *local_60;
  ch_program *local_58;
  ch_function *local_50;
  ch_table *local_48;
  ch_primitive *local_40;
  anon_union_8_4_dd993ae3_for_ch_primitive_1 local_38;
  
  stack = &context->stack;
  sVar6 = (context->stack).size;
  local_40 = &context->program_return_value;
  local_60 = &context->call_stack;
  local_58 = &context->program;
  local_48 = &context->globals;
LAB_00101c0d:
  if (context->exit != RUNNING) {
    if (context->exit == EXIT_OK) {
      puts("Program has halted.");
    }
    else {
      printf("Runtime error: %d.\n");
    }
    cVar22._4_4_ = 0;
    cVar22.type = (context->program_return_value).type;
    cVar22.field_1 =
         (anon_union_8_4_dd993ae3_for_ch_primitive_1)
         (anon_union_8_4_dd993ae3_for_ch_primitive_1)
         (context->program_return_value).field_1.object_value;
    return cVar22;
  }
  puVar4 = context->pcurrent;
  uVar1 = *puVar4;
  context->pcurrent = puVar4 + 1;
  switch(uVar1) {
  case '\0':
    context->exit = EXIT_OK;
    goto LAB_00101c0d;
  case '\x01':
    _Var8 = ch_stack_pop(stack,&local_88);
    if (_Var8) goto LAB_00101c0d;
    break;
  case '\x02':
    context->pcurrent = puVar4 + 5;
    ch_stack_popn(stack,puVar4[1]);
    goto LAB_00101c0d;
  case '\x03':
    index = (int)(context->stack).size - 1;
    goto LAB_00101ed7;
  case '\x04':
    context->pcurrent = puVar4 + 5;
    aVar12 = (anon_union_8_4_dd993ae3_for_ch_primitive_1)
             ((anon_union_8_4_dd993ae3_for_ch_primitive_1 *)
             (context->pstart + *(uint *)(puVar4 + 1)))->object_value;
LAB_00102264:
    uVar19 = 0;
    goto LAB_00102269;
  case '\x05':
    _Var8 = ch_stack_pop(stack,&local_88);
    if (_Var8) {
      value_00._4_4_ = 0;
      value_00.type = local_88.type;
      value_00.field_1.number_value = local_88.field_1.number_value;
      _Var8 = ch_checknumber(context,value_00,(double *)&local_50);
      if (_Var8) {
        aVar12.object_value = (ch_object *)((ulong)local_50 ^ 0x8000000000000000);
        goto LAB_00102264;
      }
      goto LAB_00101c0d;
    }
    break;
  case '\x06':
  case '\b':
  case '\n':
  case '\v':
    ch_stack_pop(stack,&local_88);
    ch_stack_pop(stack,&local_78);
    if (local_88.type == local_78.type) {
      if (local_88.type == PRIMITIVE_OBJECT) {
        if ((local_88.field_1.object_value)->type !=
            ((ch_object *)&(local_78.field_1.object_value)->type)->type) {
          pcVar16 = "Can only apply binary operator on matching object types.";
          goto LAB_00102315;
        }
        if ((local_88.field_1.object_value)->type != TYPE_STRING) {
          pcVar16 = "Cannot apply binary operation to object type: %d";
          goto LAB_001022c6;
        }
        if (uVar1 == '\x06') {
          aVar12.number_value =
               (double)ch_concatstring(context,local_78.field_1.number_value,
                                       local_88.field_1.number_value);
          uVar17 = 3;
        }
        else {
          aVar12.number_value = 0.0;
          ch_runtime_error(context,EXIT_UNSUPPORTED_OPERATION,"Can only use + operator on strings.")
          ;
          uVar17 = 2;
        }
        entry.field_1.object_value = aVar12.object_value;
        entry._0_8_ = uVar17;
        bVar9 = ch_stack_push(stack,entry);
        goto joined_r0x00101d45;
      }
      if (local_88.type == PRIMITIVE_NUMBER) {
        switch(uVar1) {
        case '\x06':
          aVar12.number_value = local_88.field_1.number_value + local_78.field_1.number_value;
          break;
        default:
          ch_runtime_error(context,EXIT_UNKNOWN_INSTRUCTION,"Unsupported instruction for binary op."
                          );
          aVar12.number_value = 0.0;
          break;
        case '\b':
          aVar12.number_value = local_88.field_1.number_value - local_78.field_1.number_value;
          break;
        case '\n':
          aVar12.number_value = local_88.field_1.number_value * local_78.field_1.number_value;
          break;
        case '\v':
          aVar12.number_value = local_88.field_1.number_value / local_78.field_1.number_value;
        }
        goto LAB_00102264;
      }
      pcVar16 = "Cannot apply binary operation to primitive type: %d";
LAB_001022c6:
      ch_runtime_error(context,EXIT_INCORRECT_TYPE,pcVar16);
    }
    else {
      ch_runtime_error(context,EXIT_INCORRECT_TYPE,
                       "Can only apply binary operator on matching types.");
    }
    goto LAB_00101c0d;
  case '\a':
  case '\t':
    _Var8 = ch_stack_pop(stack,&local_88);
    if (_Var8) {
      if (local_88.type != PRIMITIVE_NUMBER) {
        pcVar16 = "Expected number for addone, subone op";
LAB_00102315:
        exit = EXIT_INCORRECT_TYPE;
        goto LAB_0010231d;
      }
      aVar12.number_value =
           *(double *)(&DAT_00105290 + (ulong)(uVar1 == '\a') * 8) + local_88.field_1.number_value;
      goto LAB_00102264;
    }
    break;
  case '\f':
    context->pcurrent = puVar4 + 5;
    cVar21 = ch_bytecode_load_string(local_58,*(ch_dataptr *)(puVar4 + 1));
    aVar12.object_value = &ch_loadstring(context,cVar21.value,cVar21.size,false)->object;
    goto LAB_00101ea6;
  case '\r':
    uVar19 = 1;
    goto LAB_00101f9d;
  case '\x0e':
    aVar12.number_value = 4.94065645841247e-324;
    uVar19 = 1;
    goto LAB_00102269;
  case '\x0f':
    context->pcurrent = puVar4 + 2;
    aVar12._1_7_ = 0;
    aVar12.boolean_value = (_Bool)puVar4[1];
    uVar19 = 4;
    goto LAB_00102269;
  case '\x10':
    uVar19 = 2;
LAB_00101f9d:
    aVar12.number_value = 0.0;
    goto LAB_00102269;
  case '\x11':
    context->pcurrent = puVar4 + 5;
    index = (uint)puVar4[1] + local_60->calls[(context->call_stack).size - 1].stack_addr;
LAB_00101ed7:
    ch_stack_copy(stack,index);
    goto LAB_00101c0d;
  case '\x12':
    _Var8 = ch_stack_pop(stack,&local_88);
    if (_Var8) {
      pbVar5 = context->pcurrent;
      context->pcurrent = pbVar5 + 4;
      entry_02._4_4_ = 0;
      entry_02.type = local_88.type;
      entry_02.field_1.number_value = local_88.field_1.number_value;
      ch_stack_set(stack,(uint)*pbVar5 + local_60->calls[(context->call_stack).size - 1].stack_addr,
                   entry_02);
      goto LAB_00101c0d;
    }
    break;
  case '\x13':
    context->pcurrent = puVar4 + 2;
    pcVar13 = (local_60->calls[(context->call_stack).size - 1].closure)->upvalues[puVar4[1]]->value;
    aVar12 = (anon_union_8_4_dd993ae3_for_ch_primitive_1)(pcVar13->field_1).object_value;
    cVar3 = pcVar13->type;
LAB_001021cb:
    uVar19 = (ulong)cVar3;
    goto LAB_00102269;
  case '\x14':
    context->pcurrent = puVar4 + 2;
    bVar2 = puVar4[1];
    _Var8 = ch_stack_pop(stack,&local_88);
    if (!_Var8) goto LAB_00102408;
    pcVar13 = (local_60->calls[(context->call_stack).size - 1].closure)->upvalues[bVar2]->value;
    *(ulong *)pcVar13 = CONCAT44(local_88._4_4_,local_88.type);
    (pcVar13->field_1).number_value = (double)local_88.field_1;
    goto LAB_00101c0d;
  case '\x15':
    pcVar13 = ch_stack_get(stack,(int)(context->stack).size - 1);
    pcVar14 = context->open_upvalues;
    while ((pcVar14 != (ch_upvalue *)0x0 && (pcVar15 = pcVar14->value, pcVar13 <= pcVar15))) {
      uVar7 = *(undefined4 *)&pcVar15->field_0x4;
      aVar12 = pcVar15->field_1;
      (pcVar14->closed).type = pcVar15->type;
      *(undefined4 *)&(pcVar14->closed).field_0x4 = uVar7;
      (pcVar14->closed).field_1 = aVar12;
      pcVar14->value = &pcVar14->closed;
      pcVar14 = pcVar14->next;
      context->open_upvalues = pcVar14;
    }
    ch_stack_popn(stack,'\x01');
    goto LAB_00101c0d;
  case '\x16':
  case '\x17':
    context->pcurrent = puVar4 + 5;
    cVar21 = ch_bytecode_load_string(local_58,*(ch_dataptr *)(puVar4 + 1));
    pcVar11 = ch_loadstring(context,cVar21.value,cVar21.size,false);
    _Var8 = ch_stack_pop(stack,&local_88);
    aVar12 = local_88.field_1;
    cVar3 = local_88.type;
    if (!_Var8) {
LAB_00102408:
      context->exit = EXIT_STACK_EMPTY;
      goto LAB_00101c0d;
    }
    local_68 = function_name;
    pcVar13 = ch_table_get(local_48,pcVar11);
    if (uVar1 == '\x16') {
      if (pcVar13 != (ch_primitive *)0x0) {
        pcVar13->type = cVar3;
        (pcVar13->field_1).number_value = (double)aVar12;
        function_name = local_68;
        goto LAB_00101c0d;
      }
      pcVar16 = pcVar11->value;
      error = "Cannot assign to non existing global variable: %s.";
    }
    else {
      if (pcVar13 == (ch_primitive *)0x0) {
        value_03._4_4_ = 0;
        value_03.type = cVar3;
        value_03.field_1.number_value = aVar12.number_value;
        ch_table_set(local_48,pcVar11,value_03);
        function_name = local_68;
        goto LAB_00101c0d;
      }
      pcVar16 = pcVar11->value;
      error = "Cannot redefine global variable: %s.";
    }
    ch_runtime_error(context,EXIT_GLOBAL_NOT_FOUND,error,pcVar16);
    function_name = local_68;
    goto LAB_00101c0d;
  case '\x18':
    context->pcurrent = puVar4 + 5;
    cVar21 = ch_bytecode_load_string(local_58,*(ch_dataptr *)(puVar4 + 1));
    pcVar11 = ch_loadstring(context,cVar21.value,cVar21.size,false);
    get_global(context,pcVar11);
    goto LAB_00101c0d;
  case '\x19':
    get_global(context,function_name);
    _Var8 = ch_stack_pop(stack,&local_88);
    argcount = (ch_argcount)sVar6;
    if (_Var8) {
LAB_00102233:
      primitive._4_4_ = 0;
      primitive.type = local_88.type;
      primitive.field_1.number_value = local_88.field_1.number_value;
      try_call(context,primitive,argcount);
      goto LAB_00101c0d;
    }
    break;
  case '\x1a':
    context->pcurrent = puVar4 + 2;
    argcount = puVar4[1];
    _Var8 = ch_stack_pop(stack,&local_88);
    if (_Var8) goto LAB_00102233;
    break;
  case '\x1b':
    call_return(context);
    goto LAB_00101c0d;
  case '\x1c':
    _Var8 = ch_stack_pop(stack,&local_88);
    if (_Var8) {
      call_return(context);
      aVar12 = local_88.field_1;
      cVar3 = local_88.type;
      if ((context->call_stack).size != 0) goto LAB_001021cb;
      *(ulong *)local_40 = CONCAT44(local_88._4_4_,local_88.type);
      (local_40->field_1).number_value = (double)local_88.field_1;
      goto LAB_00101c0d;
    }
    break;
  case '\x1d':
    context->pcurrent = puVar4 + 5;
    offset = *(ch_jmpptr *)(puVar4 + 1);
    cVar22 = ch_stack_peek(stack,0);
    value_02._4_4_ = 0;
    value_02.type = cVar22.type;
    value_02.field_1.number_value = cVar22.field_1.number_value;
    _Var8 = ch_primitive_isfalsy(value_02);
    if (_Var8) {
      jump(context,offset);
    }
    goto LAB_00101c0d;
  case '\x1e':
    context->pcurrent = puVar4 + 5;
    jump(context,*(ch_jmpptr *)(puVar4 + 1));
    goto LAB_00101c0d;
  case '\x1f':
    context->pcurrent = puVar4 + 5;
    function_ptr = *(ch_dataptr *)(puVar4 + 1);
    context->pcurrent = puVar4 + 6;
    aVar12.object_value = &ch_loadfunction(function_ptr,puVar4[5])->object;
LAB_00101ea6:
    uVar19 = 3;
LAB_00102269:
    entry_01.field_1.object_value = aVar12.object_value;
    entry_01._0_8_ = uVar19;
    bVar9 = ch_stack_push(stack,entry_01);
joined_r0x00101d45:
    if (!bVar9) {
      context->exit = EXIT_STACK_SIZE_EXCEEDED;
    }
    goto LAB_00101c0d;
  case ' ':
    context->pcurrent = puVar4 + 2;
    bVar2 = puVar4[1];
    _Var8 = ch_stack_pop(stack,&local_88);
    if (!_Var8) break;
    local_50 = (ch_function *)0x0;
    value_01._4_4_ = 0;
    value_01.type = local_88.type;
    value_01.field_1.number_value = local_88.field_1.number_value;
    local_68 = function_name;
    _Var8 = ch_checkfunction(context,value_01,&local_50);
    function_name = local_68;
    if (_Var8) {
      local_38.object_value = &ch_loadclosure(local_50,bVar2)->object;
      entry_00.field_1.object_value = local_38.object_value;
      entry_00._0_8_ = 3;
      _Var8 = ch_stack_push(stack,entry_00);
      function_name = local_68;
      if (_Var8) {
        if ((ulong)bVar2 != 0) {
          uVar19 = 0;
          do {
            puVar4 = context->pcurrent;
            context->pcurrent = puVar4 + 1;
            uVar10 = (context->call_stack).size - 1;
            uVar1 = *puVar4;
            context->pcurrent = puVar4 + 2;
            if (uVar1 == '\0') {
              pcVar14 = (local_60->calls[uVar10].closure)->upvalues[puVar4[1]];
            }
            else {
              pcVar13 = ch_stack_get(stack,(uint)puVar4[1] + local_60->calls[uVar10].stack_addr);
              pcVar18 = context->open_upvalues;
              if (pcVar18 == (ch_upvalue *)0x0) {
                pcVar14 = ch_loadupvalue(pcVar13);
                pcVar14->next = (ch_upvalue *)0x0;
LAB_001020ce:
                context->open_upvalues = pcVar14;
              }
              else {
                pcVar15 = pcVar18->value;
                if (pcVar13 < pcVar15) {
                  do {
                    pcVar20 = pcVar18;
                    pcVar18 = pcVar20->next;
                    if (pcVar18 == (ch_upvalue *)0x0) {
                      pcVar14 = ch_loadupvalue(pcVar13);
                      pcVar14->next = (ch_upvalue *)0x0;
                      goto LAB_001020e7;
                    }
                    pcVar15 = pcVar18->value;
                  } while (pcVar13 < pcVar15);
                }
                else {
                  pcVar20 = (ch_upvalue *)0x0;
                }
                pcVar14 = pcVar18;
                if (pcVar15 != pcVar13) {
                  pcVar14 = ch_loadupvalue(pcVar13);
                  pcVar14->next = pcVar18;
                  if (pcVar20 == (ch_upvalue *)0x0) goto LAB_001020ce;
LAB_001020e7:
                  pcVar20->next = pcVar14;
                }
              }
            }
            (*(ch_upvalue ***)(local_38.object_value + 4))[uVar19] = pcVar14;
            uVar19 = uVar19 + 1;
            function_name = local_68;
          } while (uVar19 != bVar2);
        }
      }
      else {
        context->exit = EXIT_STACK_SIZE_EXCEEDED;
      }
    }
    goto LAB_00101c0d;
  default:
    exit = EXIT_UNKNOWN_INSTRUCTION;
    pcVar16 = "Unknown instruction.";
LAB_0010231d:
    ch_runtime_error(context,exit,pcVar16);
    goto LAB_00101c0d;
  }
  context->exit = EXIT_STACK_EMPTY;
  goto LAB_00101c0d;
}

Assistant:

ch_primitive ch_vm_call(ch_context *context, ch_string *function_name) {
  size_t initial_stack_size = context->stack.size;

  while (context->exit == RUNNING) {
    uint8_t opcode = *(context->pcurrent);
    context->pcurrent++;

    switch (opcode) {
    case OP_NUMBER: {
      double value = LOAD_NUMBER(context, VM_READ_PTR(context));
      STACK_PUSH(context, MAKE_NUMBER(value));
      break;
    }
    case OP_STRING: {
      ch_string* string = read_string(context);
      STACK_PUSH(context, MAKE_OBJECT(string));
      break;
    }
    case OP_FALSE: { 
      STACK_PUSH(context, MAKE_BOOLEAN(false));
      break;
    }
    case OP_TRUE: { 
      STACK_PUSH(context, MAKE_BOOLEAN(true));
      break;
    }
    case OP_CHAR: {
      char value = VM_READ_CHAR(context);
      STACK_PUSH(context, MAKE_CHAR(value));
      break;
    }
    case OP_NULL: {
      STACK_PUSH(context, MAKE_NULL());
      break;
    }
    case OP_ADD: 
    case OP_SUB:
    case OP_MUL:
    case OP_DIV: {
      ch_primitive args[2];
      binary_op_args(context, args);

      if (args[0].type != args[1].type) {
        ch_runtime_error(context, EXIT_INCORRECT_TYPE, "Can only apply binary operator on matching types.");
        break;
      }

      ch_primitive result;
      if (IS_NUMBER(args[0])) {
        STACK_PUSH(context, binary_op_number(context, args, opcode));
        break;
      }

      if (IS_OBJECT(args[0])) {
        ch_object* object_args[2] = {AS_OBJECT(args[0]), AS_OBJECT(args[1])};
        if (object_args[0]->type != object_args[1]->type) {
          ch_runtime_error(context, EXIT_INCORRECT_TYPE, "Can only apply binary operator on matching object types.");
          break;
        }

        if (IS_STRING(object_args[0])) {
          STACK_PUSH(context, binary_op_string(context, object_args, opcode));
          break;
        }

        ch_runtime_error(context, EXIT_INCORRECT_TYPE, "Cannot apply binary operation to object type: %d", object_args[0]->type);
        break;
      }

      ch_runtime_error(context, EXIT_INCORRECT_TYPE, "Cannot apply binary operation to primitive type: %d", args[0].type);
      break;
    }
    case OP_ADDONE:
    case OP_SUBONE: {
      ch_primitive entry;
      STACK_POP(context, &entry);
      if (!IS_NUMBER(entry)) {
        ch_runtime_error(context, EXIT_INCORRECT_TYPE, "Expected number for addone, subone op");
        break;
      }

      double value;
      if (opcode == OP_ADDONE) {
        value = AS_NUMBER(entry) + 1;
      } else {
        value = AS_NUMBER(entry) - 1;
      }

      STACK_PUSH(context, MAKE_NUMBER(value));
      break;
    }
    case OP_NEGATE: {
      ch_primitive entry;
      STACK_POP(context, &entry);

      double value;
      if(ch_checknumber(context, entry, &value)) {
        STACK_PUSH(context, MAKE_NUMBER(-value));
      }
      break;
    }
    case OP_HALT: {
      context->exit = EXIT_OK;
      break;
    }
    case OP_POP: {
      ch_primitive entry;
      STACK_POP(context, &entry);
      break;
    }
    case OP_POPN: {
      ch_dataptr num_popped = VM_READ_PTR(context);

      // TODO add runtime check?
      ch_stack_popn(&context->stack, num_popped);
      break;
    }
    case OP_TOP: {
      ch_stack_copy(&context->stack, CH_STACK_ADDR(&context->stack) - 1);
      break;
    }
    case OP_LOAD_LOCAL: {
      uint8_t offset = (uint8_t)VM_READ_PTR(context);
      ch_stack_addr index = CURRENT_CALL(context).stack_addr + offset;
      ch_stack_copy(&context->stack, index);
      break;
    }
    case OP_SET_LOCAL: {
      ch_primitive entry;
      STACK_POP(context, &entry);

      uint8_t offset = (uint8_t)VM_READ_PTR(context);
      ch_stack_addr index = CURRENT_CALL(context).stack_addr + offset;

      ch_stack_set(&context->stack, index, entry);
      break;
    }
    case OP_LOAD_UPVALUE: {
      uint8_t index = VM_READ_ARGCOUNT(context);
      ch_primitive* value = CURRENT_CALL(context).closure->upvalues[index]->value;
      STACK_PUSH(context, *value);
      break;
    }
    case OP_SET_UPVALUE: {
      uint8_t index = VM_READ_ARGCOUNT(context);
      ch_primitive value;
      STACK_POP(context, &value);

      *CURRENT_CALL(context).closure->upvalues[index]->value = value;
      break;
    }
    case OP_CLOSE_UPVALUE: {
      ch_primitive* closed = ch_stack_get(&context->stack, context->stack.size - 1);
      close_upvalues(context, closed);
      ch_stack_popn(&context->stack, 1);
      break;
    }
    case OP_DEFINE_GLOBAL:
    case OP_SET_GLOBAL: {
      ch_string *name = read_string(context);

      ch_primitive entry;
      STACK_POP(context, &entry);

      set_global(context, name, entry, opcode == OP_SET_GLOBAL ? REDEFINE_GLOBAL : CREATE_GLOBAL);

      break;
    }
    case OP_LOAD_GLOBAL: {
      ch_string *name = read_string(context);
      get_global(context, name);
      break;
    }
    case OP_FUNCTION: {
      ch_dataptr function_ptr = VM_READ_PTR(context);
      ch_argcount argcount = VM_READ_ARGCOUNT(context);
      ch_primitive function =
          MAKE_OBJECT(ch_loadfunction(function_ptr, argcount));
      STACK_PUSH(context, function);
      break;
    }
    case OP_CLOSURE: {
      uint8_t upvalue_count = VM_READ_ARGCOUNT(context);
      ch_primitive value;
      STACK_POP(context, &value);
      ch_function* function = NULL;
      if(!ch_checkfunction(context, value, &function)) break;

      ch_closure* closure = ch_loadclosure(function, upvalue_count);
      STACK_PUSH(context, MAKE_OBJECT(closure));

      for(uint8_t i = 0; i < upvalue_count; i++) {
        uint8_t is_local = VM_READ_ARGCOUNT(context);
        uint8_t index = VM_READ_ARGCOUNT(context);

        if (is_local) {
          ch_stack_addr addr = CURRENT_CALL(context).stack_addr + index;
          closure->upvalues[i] = capture_upvalue(context, ch_stack_get(&context->stack, addr));
        } else {
          closure->upvalues[i] = CURRENT_CALL(context).closure->upvalues[index];
        }
      }
      break;
    }
    case OP_BEGIN: {
      get_global(context, function_name);
      ch_primitive function;
      STACK_POP(context, &function);

      try_call(context, function, initial_stack_size);
      break;
    }
    case OP_CALL: {
      ch_argcount argcount = VM_READ_ARGCOUNT(context);

      ch_primitive function;
      STACK_POP(context, &function);

      try_call(context, function, argcount);
      break;
    }
    case OP_RETURN_VALUE: {
      ch_primitive returned_value;
      STACK_POP(context, &returned_value);

      call_return(context);

      // Check if we are returning from the main function
      if (context->call_stack.size != 0) {
        STACK_PUSH(context, returned_value);
      } else {
        context->program_return_value = returned_value;
      }

      break;
    }
    case OP_RETURN_VOID: {
      call_return(context);
      break;
    }
    case OP_JMP: {
      ch_jmpptr ptr = VM_READ_JMPPTR(context);
      jump(context, ptr);
      break;
    }
    case OP_JMP_FALSE: {
      ch_jmpptr ptr = VM_READ_JMPPTR(context);

      ch_primitive peek = ch_stack_peek(&context->stack, 0);

      if (ch_primitive_isfalsy(peek)) {
        jump(context, ptr);
      }
      break;
    }
    default: {
      ch_runtime_error(context, EXIT_UNKNOWN_INSTRUCTION,
                       "Unknown instruction.");
      break;
    }
    }
  }

  if (context->exit != EXIT_OK) {
    printf("Runtime error: %d.\n", context->exit);
  } else {
    printf("Program has halted.\n");
  }

  return context->program_return_value;
}